

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O0

void Eigen::internal::
     visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>,_0>,_Eigen::internal::visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>,_-1>
     ::run(visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>_> *mat,
          max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>,_0>
          *visitor)

{
  EVP_PKEY_CTX *ctx;
  Index IVar1;
  CoeffReturnType pfVar2;
  undefined8 local_30;
  Index i_1;
  Index j;
  Index i;
  max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>,_0>
  *visitor_local;
  visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>_> *mat_local;
  
  ctx = (EVP_PKEY_CTX *)
        visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::coeff
                  (mat,0,0);
  coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::init
            (&visitor->
              super_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>_>,
             ctx);
  j = 1;
  while( true ) {
    IVar1 = visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
            rows(mat);
    if (IVar1 <= j) break;
    pfVar2 = visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
             coeff(mat,j,0);
    max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>,_0>::
    operator()(visitor,pfVar2,j,0);
    j = j + 1;
  }
  i_1 = 1;
  while( true ) {
    IVar1 = visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
            cols(mat);
    if (IVar1 <= i_1) break;
    local_30 = 0;
    while( true ) {
      IVar1 = visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
              rows(mat);
      if (IVar1 <= local_30) break;
      pfVar2 = visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
               coeff(mat,local_30,i_1);
      max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>,_0>::
      operator()(visitor,pfVar2,local_30,i_1);
      local_30 = local_30 + 1;
    }
    i_1 = i_1 + 1;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const Derived& mat, Visitor& visitor)
  {
    visitor.init(mat.coeff(0,0), 0, 0);
    for(Index i = 1; i < mat.rows(); ++i)
      visitor(mat.coeff(i, 0), i, 0);
    for(Index j = 1; j < mat.cols(); ++j)
      for(Index i = 0; i < mat.rows(); ++i)
        visitor(mat.coeff(i, j), i, j);
  }